

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::binary_op_rsub<float>>(Mat *a,float b,Option *opt)

{
  long in_RDI;
  float fVar1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  binary_op_rsub<float> op;
  float *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Mat local_70;
  float *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  binary_op_rsub<float> local_19 [13];
  float local_c [3];
  
  local_20 = *(int *)(in_RDI + 0x24);
  local_24 = *(int *)(in_RDI + 0x28);
  local_28 = *(int *)(in_RDI + 0x2c);
  local_2c = local_20 * local_24;
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    in_stack_ffffffffffffff80 = Mat::operator_cast_to_float_(&local_70);
    Mat::~Mat((Mat *)0x142929);
    local_38 = in_stack_ffffffffffffff80;
    for (in_stack_ffffffffffffff8c = 0; in_stack_ffffffffffffff8c < local_2c;
        in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 1) {
      fVar1 = binary_op_rsub<float>::operator()
                        (local_19,local_38 + in_stack_ffffffffffffff8c,local_c);
      local_38[in_stack_ffffffffffffff8c] = fVar1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = a.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = op(ptr[i], b);
        }
    }

    return 0;
}